

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

int xmlNewInputFromUrl(char *filename,int flags,xmlParserInputPtr *out)

{
  xmlParserInputBufferCreateFilenameFunc *pp_Var1;
  xmlParserInputPtr pxVar2;
  int local_3c;
  int code;
  xmlParserInputPtr input;
  xmlParserInputBufferPtr buf;
  xmlParserInputPtr *out_local;
  char *pcStack_18;
  int flags_local;
  char *filename_local;
  
  local_3c = 0;
  if (out == (xmlParserInputPtr *)0x0) {
    filename_local._4_4_ = 0x73;
  }
  else {
    *out = (xmlParserInputPtr)0x0;
    if (filename == (char *)0x0) {
      filename_local._4_4_ = 0x73;
    }
    else {
      buf = (xmlParserInputBufferPtr)out;
      out_local._4_4_ = flags;
      pcStack_18 = filename;
      pp_Var1 = __xmlParserInputBufferCreateFilenameValue();
      if (*pp_Var1 == (xmlParserInputBufferCreateFilenameFunc)0x0) {
        local_3c = xmlParserInputBufferCreateUrl
                             (pcStack_18,XML_CHAR_ENCODING_NONE,out_local._4_4_,
                              (xmlParserInputBufferPtr *)&input);
      }
      else {
        pp_Var1 = __xmlParserInputBufferCreateFilenameValue();
        input = (xmlParserInputPtr)(**pp_Var1)(pcStack_18,XML_CHAR_ENCODING_NONE);
        if (input == (xmlParserInputPtr)0x0) {
          local_3c = 0x5f4;
        }
      }
      if (local_3c == 0) {
        pxVar2 = xmlNewInputInternal((xmlParserInputBufferPtr)input,pcStack_18);
        if (pxVar2 == (xmlParserInputPtr)0x0) {
          filename_local._4_4_ = 2;
        }
        else {
          buf->context = pxVar2;
          filename_local._4_4_ = 0;
        }
      }
      else {
        filename_local._4_4_ = local_3c;
      }
    }
  }
  return filename_local._4_4_;
}

Assistant:

int
xmlNewInputFromUrl(const char *filename, int flags, xmlParserInputPtr *out) {
    xmlParserInputBufferPtr buf;
    xmlParserInputPtr input;
    int code = XML_ERR_OK;

    if (out == NULL)
        return(XML_ERR_ARGUMENT);
    *out = NULL;
    if (filename == NULL)
        return(XML_ERR_ARGUMENT);

    if (xmlParserInputBufferCreateFilenameValue != NULL) {
        buf = xmlParserInputBufferCreateFilenameValue(filename,
                XML_CHAR_ENCODING_NONE);
        if (buf == NULL)
            code = XML_IO_ENOENT;
    } else {
        code = xmlParserInputBufferCreateUrl(filename, XML_CHAR_ENCODING_NONE,
                                             flags, &buf);
    }
    if (code != XML_ERR_OK)
	return(code);

    input = xmlNewInputInternal(buf, filename);
    if (input == NULL)
	return(XML_ERR_NO_MEMORY);

#ifdef LIBXML_HTTP_ENABLED
    code = xmlCheckHTTPInputInternal(input);
    if (code != XML_ERR_OK) {
        xmlFreeInputStream(input);
        return(code);
    }
#endif

    *out = input;
    return(XML_ERR_OK);
}